

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O0

void __thiscall HAXX_UNARY_OP::complex_unary_sub::test_method(complex_unary_sub *this)

{
  undefined8 uVar1;
  bool bVar2;
  complex<double> x;
  quaternion<double> q;
  _CF *in_stack_fffffffffffffd08;
  quaternion<double> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  undefined1 local_208 [32];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [16];
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [32];
  undefined1 local_180 [40];
  undefined1 local_158 [16];
  basic_cstring<const_char> local_148;
  undefined1 local_138 [32];
  undefined1 local_118 [40];
  undefined1 local_f0 [16];
  basic_cstring<const_char> local_e0;
  quaternion<double> local_d0;
  basic_cstring<const_char> local_b0;
  undefined1 local_a0 [40];
  undefined1 local_78 [16];
  basic_cstring<const_char> local_68;
  complex<double> local_58;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  std::complex<double>::complex(&local_58,-4.76,5.6);
  HAXX::quaternion<double>::operator-=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_68,0x86,local_78);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_d0._M_imag_i = HAXX::quaternion<double>::real(&local_28);
    local_d0._M_real = std::complex<double>::real_abi_cxx11_(&local_58);
    local_d0._M_real = 1.0 - local_d0._M_real;
    in_stack_fffffffffffffd18 = "1. - x.real()";
    in_stack_fffffffffffffd10 = &local_d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_a0,&local_b0,0x86,1,2,&local_d0._M_imag_i,"q.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1acc04);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x87,local_f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_138 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_138._8_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_138._0_8_ = std::complex<double>::imag_abi_cxx11_(&local_58);
    local_138._0_8_ = 2.0 - (double)local_138._0_8_;
    in_stack_fffffffffffffd18 = "2. - x.imag()";
    in_stack_fffffffffffffd10 = (quaternion<double> *)local_138;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_118,local_138 + 0x10,0x87,1,2,local_138 + 8,"q.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1acd85);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_148,0x88,local_158);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1a0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_1a0._8_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_1a0._0_8_ = 3.0;
    in_stack_fffffffffffffd18 = "3.";
    in_stack_fffffffffffffd10 = (quaternion<double> *)local_1a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_180,local_1a0 + 0x10,0x88,1,2,local_1a0 + 8,"q.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1acebe);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x89,local_1c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd18,(char (*) [1])in_stack_fffffffffffffd10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_208 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_208._8_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_208._0_8_ = 4.0;
    in_stack_fffffffffffffd18 = "4.";
    in_stack_fffffffffffffd10 = (quaternion<double> *)local_208;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_1e8,local_208 + 0x10,0x89,1,2,local_208 + 8,"q.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1acff7);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(complex_unary_sub)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.);
  std::complex<double> x(-4.76,5.6);
  q -= x;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),1. - x.real());
  BOOST_CHECK_EQUAL(q.imag_i(),2. - x.imag());
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);

}